

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O1

void info_print_typedef_detail(lyout *outf,lys_tpdf *tpdf,int *UNUSED_first)

{
  ly_print(outf,"%-*s%s\n",0xb,"Typedef: ",tpdf->name);
  ly_print(outf,"%-*s%s\n",0xb,"Module: ",tpdf->module->name);
  info_print_text(outf,tpdf->dsc,"Desc: ");
  info_print_text(outf,tpdf->ref,"Reference: ");
  info_print_flags(outf,tpdf->flags,0x38,0);
  info_print_type_detail_(outf,&tpdf->type,0);
  info_print_text(outf,tpdf->units,"Units: ");
  info_print_text(outf,tpdf->dflt,"Default: ");
  return;
}

Assistant:

static void
info_print_typedef_detail(struct lyout *outf, const struct lys_tpdf *tpdf, int * UNUSED(first))
{
    ly_print(outf, "%-*s%s\n", INDENT_LEN, "Typedef: ", tpdf->name);
    ly_print(outf, "%-*s%s\n", INDENT_LEN, "Module: ", tpdf->module->name);
    info_print_text(outf, tpdf->dsc, "Desc: ");
    info_print_text(outf, tpdf->ref, "Reference: ");
    info_print_flags(outf, tpdf->flags, LYS_STATUS_MASK, 0);
    info_print_type_detail_(outf, &tpdf->type, 0);
    info_print_text(outf, tpdf->units, "Units: ");
    info_print_text(outf, tpdf->dflt, "Default: ");
}